

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearList.cpp
# Opt level: O1

bool DeleteElem(LinearList *L,int i)

{
  ElementType *pEVar1;
  int iVar2;
  
  if ((-1 < i) && (L->Last != 0 && i <= L->Last)) {
    iVar2 = L->Last + -1;
    if (i < iVar2) {
      pEVar1 = L->data + (uint)i;
      do {
        *pEVar1 = pEVar1[1];
        iVar2 = L->Last + -1;
        i = i + 1;
        pEVar1 = pEVar1 + 1;
      } while (i < iVar2);
    }
    L->Last = iVar2;
    return true;
  }
  return false;
}

Assistant:

bool DeleteElem(LinearList *L,int i)  //删除表中第i个结点
{
    if(i<0 || i > L->Last || L->Last==0)
        return false;  //第i个结点不存在，删除失败
    else
    {
        int j;
        for(j = i; j < L->Last-1; j++)
            L->data[j] = L->data[j+1];  //前移
        L->Last--;  //表长-1
        return true;  //删除成功
    }
}